

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

void duckdb::ListCombineFunction
               (Vector *states_vector,Vector *combined,AggregateInputData *aggr_input_data,
               idx_t count)

{
  data_ptr_t pdVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  LinkedList *linked_list;
  LinkedList *linked_list_00;
  FunctionData *pFVar5;
  LogicalType *other;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  idx_t iVar9;
  UnifiedVectorFormat *this;
  LogicalType result_type;
  UnifiedVectorFormat states_data;
  RecursiveUnifiedVectorFormat input_data;
  Vector input;
  ulong local_1b0;
  ulong local_1a8;
  data_ptr_t local_1a0;
  data_ptr_t local_198;
  ulong local_190;
  LogicalType local_188;
  LogicalType local_170;
  UnifiedVectorFormat local_158;
  SelectionVector *local_110;
  data_ptr_t local_108;
  Vector local_98;
  
  if (aggr_input_data->combine_type == ALLOW_DESTRUCTIVE) {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_110);
    Vector::ToUnifiedFormat(states_vector,count,(UnifiedVectorFormat *)&local_110);
    pdVar1 = combined->data;
    for (iVar7 = 0; count != iVar7; iVar7 = iVar7 + 1) {
      iVar9 = iVar7;
      if (local_110->sel_vector != (sel_t *)0x0) {
        iVar9 = (idx_t)local_110->sel_vector[iVar7];
      }
      plVar2 = *(long **)(local_108 + iVar9 * 8);
      lVar3 = *plVar2;
      if (lVar3 != 0) {
        plVar4 = *(long **)(pdVar1 + iVar7 * 8);
        if (*plVar4 == 0) {
          plVar4[2] = plVar2[2];
          lVar3 = plVar2[1];
          *plVar4 = *plVar2;
          plVar4[1] = lVar3;
        }
        else {
          *(long *)(plVar4[2] + 8) = plVar2[1];
          *(long *)(*(long *)(pdVar1 + iVar7 * 8) + 0x10) = plVar2[2];
          **(long **)(pdVar1 + iVar7 * 8) = **(long **)(pdVar1 + iVar7 * 8) + lVar3;
        }
      }
    }
    this = (UnifiedVectorFormat *)&local_110;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_158);
    Vector::ToUnifiedFormat(states_vector,count,&local_158);
    local_198 = local_158.data;
    local_1a0 = combined->data;
    pFVar5 = optional_ptr<duckdb::FunctionData,_true>::operator->(&aggr_input_data->bind_data);
    other = ListType::GetChildType((LogicalType *)(pFVar5 + 1));
    LogicalType::LogicalType(&local_188,other);
    uVar8 = 0;
    local_1a8 = count;
    while (uVar8 != local_1a8) {
      uVar6 = uVar8;
      if ((local_158.sel)->sel_vector != (sel_t *)0x0) {
        uVar6 = (ulong)(local_158.sel)->sel_vector[uVar8];
      }
      linked_list = *(LinkedList **)(local_198 + uVar6 * 8);
      linked_list_00 = *(LinkedList **)(local_1a0 + uVar8 * 8);
      iVar7 = linked_list->total_capacity;
      local_190 = uVar8;
      LogicalType::LogicalType(&local_170,&local_188);
      Vector::Vector(&local_98,&local_170,linked_list->total_capacity);
      LogicalType::~LogicalType(&local_170);
      ListSegmentFunctions::BuildListVector
                ((ListSegmentFunctions *)(pFVar5 + 4),linked_list,&local_98,0);
      RecursiveUnifiedVectorFormat::RecursiveUnifiedVectorFormat
                ((RecursiveUnifiedVectorFormat *)&local_110);
      Vector::RecursiveToUnifiedFormat(&local_98,iVar7,(RecursiveUnifiedVectorFormat *)&local_110);
      for (local_1b0 = 0; local_1b0 < iVar7; local_1b0 = local_1b0 + 1) {
        ArenaAllocator::AlignNext(aggr_input_data->allocator);
        ListSegmentFunctions::AppendRow
                  ((ListSegmentFunctions *)(pFVar5 + 4),aggr_input_data->allocator,linked_list_00,
                   (RecursiveUnifiedVectorFormat *)&local_110,&local_1b0);
      }
      RecursiveUnifiedVectorFormat::~RecursiveUnifiedVectorFormat
                ((RecursiveUnifiedVectorFormat *)&local_110);
      Vector::~Vector(&local_98);
      uVar8 = local_190 + 1;
    }
    LogicalType::~LogicalType(&local_188);
    this = &local_158;
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

static void ListCombineFunction(Vector &states_vector, Vector &combined, AggregateInputData &aggr_input_data,
                                idx_t count) {

	//	Can we use destructive combining?
	if (aggr_input_data.combine_type == AggregateCombineType::ALLOW_DESTRUCTIVE) {
		ListAbsorbFunction(states_vector, combined, aggr_input_data, count);
		return;
	}

	UnifiedVectorFormat states_data;
	states_vector.ToUnifiedFormat(count, states_data);
	auto states_ptr = UnifiedVectorFormat::GetData<const ListAggState *>(states_data);
	auto combined_ptr = FlatVector::GetData<ListAggState *>(combined);

	auto &list_bind_data = aggr_input_data.bind_data->Cast<ListBindData>();
	auto result_type = ListType::GetChildType(list_bind_data.stype);

	for (idx_t i = 0; i < count; i++) {
		auto &source = *states_ptr[states_data.sel->get_index(i)];
		auto &target = *combined_ptr[i];

		const auto entry_count = source.linked_list.total_capacity;
		Vector input(result_type, source.linked_list.total_capacity);
		list_bind_data.functions.BuildListVector(source.linked_list, input, 0);

		RecursiveUnifiedVectorFormat input_data;
		Vector::RecursiveToUnifiedFormat(input, entry_count, input_data);

		for (idx_t entry_idx = 0; entry_idx < entry_count; ++entry_idx) {
			aggr_input_data.allocator.AlignNext();
			list_bind_data.functions.AppendRow(aggr_input_data.allocator, target.linked_list, input_data, entry_idx);
		}
	}
}